

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

UINT32 __thiscall PlayerA::GetFileSize(PlayerA *this)

{
  UINT32 result;
  PlayerA *this_local;
  
  if (this->_dLoad == (DATA_LOADER *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = DataLoader_GetTotalSize(this->_dLoad);
    if (this_local._4_4_ == 0xffffffff) {
      this_local._4_4_ = DataLoader_GetSize(this->_dLoad);
    }
  }
  return this_local._4_4_;
}

Assistant:

UINT32 PlayerA::GetFileSize(void)
{
	if (_dLoad == NULL)
		return 0x00;
	
	UINT32 result = DataLoader_GetTotalSize(_dLoad);
	if (result != (UINT32)-1)
		return result;
	else
		return DataLoader_GetSize(_dLoad);
}